

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.h
# Opt level: O2

void __thiscall CVmRun::push_string(CVmRun *this,char *str)

{
  size_t len;
  CVmRun *this_00;
  
  this_00 = (CVmRun *)str;
  len = strlen(str);
  push_string(this_00,str,len);
  return;
}

Assistant:

void push_string(VMG_ const char *str)
        { push_string(vmg_ str, strlen(str)); }